

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

bool Assimp::PLY::PropertyInstance::ParseValueBinary
               (IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
               char **pCur,uint *bufferSize,EDataType eType,ValueUnion *out,bool p_bBE)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  DeadlyImportError *this;
  ValueUnion local_108;
  double t_7;
  float t_6;
  int8_t t_5;
  int16_t t_4;
  int32_t t_3;
  uint8_t t_2;
  uint16_t t_1;
  uint32_t t;
  bool ret;
  char *local_c8;
  char *local_c0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_b8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_b0;
  const_iterator local_a8;
  allocator_type local_99;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_98;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_90;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_88;
  vector<char,_std::allocator<char>_> local_80;
  undefined1 local_58 [8];
  vector<char,_std::allocator<char>_> nbuffer;
  uint lsize;
  bool p_bBE_local;
  ValueUnion *out_local;
  EDataType eType_local;
  uint *bufferSize_local;
  char **pCur_local;
  vector<char,_std::allocator<char>_> *buffer_local;
  IOStreamBuffer<char> *streamBuffer_local;
  
  nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = p_bBE;
  if (out == (ValueUnion *)0x0) {
    __assert_fail("__null != out",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyParser.cpp"
                  ,0x3e0,
                  "static bool Assimp::PLY::PropertyInstance::ParseValueBinary(IOStreamBuffer<char> &, std::vector<char> &, const char *&, unsigned int &, PLY::EDataType, PLY::PropertyInstance::ValueUnion *, bool)"
                 );
  }
  nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 0;
  switch(eType) {
  case EDT_Char:
  case EDT_UChar:
    nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 1;
    break;
  case EDT_Short:
  case EDT_UShort:
    nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 2;
    break;
  case EDT_Int:
  case EDT_UInt:
  case EDT_Float:
    nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 4;
    break;
  case EDT_Double:
    nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 8;
    break;
  case EDT_INVALID:
  }
  if (*bufferSize < (uint)nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_58);
    bVar3 = IOStreamBuffer<char>::getNextBlock
                      (streamBuffer,(vector<char,_std::allocator<char>_> *)local_58);
    if (!bVar3) {
      t_1._0_1_ = 1;
      this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&t,"Invalid .ply file: File corrupted",
                 (allocator<char> *)((long)&t_1 + 1));
      DeadlyImportError::DeadlyImportError(this,(string *)&t);
      t_1._0_1_ = 0;
      __cxa_throw(this,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    local_90._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(buffer);
    local_88 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator-(&local_90,(ulong)*bufferSize);
    local_98._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(buffer);
    std::allocator<char>::allocator();
    std::vector<char,std::allocator<char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((vector<char,std::allocator<char>> *)&local_80,local_88,local_98,&local_99);
    std::vector<char,_std::allocator<char>_>::operator=(buffer,&local_80);
    std::vector<char,_std::allocator<char>_>::~vector(&local_80);
    std::allocator<char>::~allocator(&local_99);
    local_b0._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(buffer);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_a8,
               &local_b0);
    local_b8._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin
                           ((vector<char,_std::allocator<char>_> *)local_58);
    local_c0 = (char *)std::vector<char,_std::allocator<char>_>::end
                                 ((vector<char,_std::allocator<char>_> *)local_58);
    local_c8 = (char *)std::vector<char,std::allocator<char>>::
                       insert<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                                 ((vector<char,std::allocator<char>> *)buffer,local_a8,local_b8,
                                  (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                   )local_c0);
    std::vector<char,_std::allocator<char>_>::clear((vector<char,_std::allocator<char>_> *)local_58)
    ;
    sVar4 = std::vector<char,_std::allocator<char>_>::size(buffer);
    *bufferSize = (uint)sVar4;
    pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](buffer,0);
    *pCur = pvVar5;
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_58);
  }
  t_2 = '\x01';
  switch(eType) {
  case EDT_Char:
    cVar2 = **pCur;
    *pCur = *pCur + 1;
    *(int *)out = (int)cVar2;
    break;
  case EDT_UChar:
    bVar1 = **pCur;
    *pCur = *pCur + 1;
    *(uint *)out = (uint)bVar1;
    break;
  case EDT_Short:
    t_7._6_2_ = *(short *)*pCur;
    *pCur = *pCur + 2;
    if ((nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ & 1) != 0) {
      ByteSwap::Swap((int16_t *)((long)&t_7 + 6));
    }
    *(int *)out = (int)t_7._6_2_;
    break;
  case EDT_UShort:
    t_4 = *(int16_t *)*pCur;
    *pCur = *pCur + 2;
    if ((nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ & 1) != 0) {
      ByteSwap::Swap((uint16_t *)&t_4);
    }
    *(uint *)out = (uint)(ushort)t_4;
    break;
  case EDT_Int:
    t_6 = *(float *)*pCur;
    *pCur = *pCur + 4;
    if ((nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ & 1) != 0) {
      ByteSwap::Swap((int32_t *)&t_6);
    }
    out->fFloat = t_6;
    break;
  case EDT_UInt:
    t_3 = *(int32_t *)*pCur;
    *pCur = *pCur + 4;
    if ((nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ & 1) != 0) {
      ByteSwap::Swap((uint32_t *)&t_3);
    }
    out->iInt = t_3;
    break;
  case EDT_Float:
    t_7._0_4_ = *(int32_t *)*pCur;
    *pCur = *pCur + 4;
    if ((nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ & 1) != 0) {
      ByteSwap::Swap((float *)&t_7);
    }
    out->iInt = t_7._0_4_;
    break;
  case EDT_Double:
    local_108 = *(ValueUnion *)*pCur;
    *pCur = *pCur + 8;
    if ((nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ & 1) != 0) {
      ByteSwap::Swap(&local_108.fDouble);
    }
    *out = local_108;
    break;
  default:
    t_2 = '\0';
  }
  *bufferSize = *bufferSize - nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_
  ;
  return (bool)(t_2 & 1);
}

Assistant:

bool PLY::PropertyInstance::ParseValueBinary(IOStreamBuffer<char> &streamBuffer,
  std::vector<char> &buffer,
  const char* &pCur,
  unsigned int &bufferSize,
  PLY::EDataType eType,
  PLY::PropertyInstance::ValueUnion* out,
  bool p_bBE)
{
  ai_assert(NULL != out);

  //calc element size
  unsigned int lsize = 0;
  switch (eType)
  {
  case EDT_Char:
  case EDT_UChar:
    lsize = 1;
    break;

  case EDT_UShort:
  case EDT_Short:
    lsize = 2;
    break;

  case EDT_UInt:
  case EDT_Int:
  case EDT_Float:
    lsize = 4;
    break;

  case EDT_Double:
    lsize = 8;
    break;

  case EDT_INVALID:
  default:
      break;
  }

  //read the next file block if needed
  if (bufferSize < lsize)
  {
    std::vector<char> nbuffer;
    if (streamBuffer.getNextBlock(nbuffer))
    {
      //concat buffer contents
      buffer = std::vector<char>(buffer.end() - bufferSize, buffer.end());
      buffer.insert(buffer.end(), nbuffer.begin(), nbuffer.end());
      nbuffer.clear();
      bufferSize = static_cast<unsigned int>(buffer.size());
      pCur = (char*)&buffer[0];
    }
    else
    {
      throw DeadlyImportError("Invalid .ply file: File corrupted");
    }
  }

  bool ret = true;
  switch (eType)
  {
  case EDT_UInt:
  {
    uint32_t t;
    memcpy(&t, pCur, sizeof(uint32_t));
    pCur += sizeof(uint32_t);

    // Swap endianness
    if (p_bBE)ByteSwap::Swap(&t);
    out->iUInt = t;
    break;
  }

  case EDT_UShort:
  {
    uint16_t t;
    memcpy(&t, pCur, sizeof(uint16_t));
    pCur += sizeof(uint16_t);

    // Swap endianness
    if (p_bBE)ByteSwap::Swap(&t);
    out->iUInt = t;
    break;
  }

  case EDT_UChar:
  {
    uint8_t t;
    memcpy(&t, pCur, sizeof(uint8_t));
    pCur += sizeof(uint8_t);
    out->iUInt = t;
    break;
  }

  case EDT_Int:
  {
    int32_t t;
    memcpy(&t, pCur, sizeof(int32_t));
    pCur += sizeof(int32_t);

    // Swap endianness
    if (p_bBE)ByteSwap::Swap(&t);
    out->iInt = t;
    break;
  }

  case EDT_Short:
  {
    int16_t t;
    memcpy(&t, pCur, sizeof(int16_t));
    pCur += sizeof(int16_t);

    // Swap endianness
    if (p_bBE)ByteSwap::Swap(&t);
    out->iInt = t;
    break;
  }

  case EDT_Char:
  {
    int8_t t;
    memcpy(&t, pCur, sizeof(int8_t));
    pCur += sizeof(int8_t);
    out->iInt = t;
    break;
  }

  case EDT_Float:
  {
    float t;
    memcpy(&t, pCur, sizeof(float));
    pCur += sizeof(float);

    // Swap endianness
    if (p_bBE)ByteSwap::Swap(&t);
    out->fFloat = t;
    break;
  }
  case EDT_Double:
  {
    double t;
    memcpy(&t, pCur, sizeof(double));
    pCur += sizeof(double);

    // Swap endianness
    if (p_bBE)ByteSwap::Swap(&t);
    out->fDouble = t;
    break;
  }
  default:
    ret = false;
  }

  bufferSize -= lsize;

  return ret;
}